

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

int prvTidytmbstrcasecmp(ctmbstr s1,ctmbstr s2)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ctmbstr ptStack_20;
  uint c;
  ctmbstr s2_local;
  ctmbstr s1_local;
  
  ptStack_20 = s2;
  s2_local = s1;
  while( true ) {
    cVar1 = *s2_local;
    uVar2 = prvTidyToLower((int)cVar1);
    uVar3 = prvTidyToLower((int)*ptStack_20);
    if (uVar2 != uVar3) {
      s1_local._4_4_ = -1;
      if (*ptStack_20 < *s2_local) {
        s1_local._4_4_ = 1;
      }
      return s1_local._4_4_;
    }
    if ((int)cVar1 == 0) break;
    s2_local = s2_local + 1;
    ptStack_20 = ptStack_20 + 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrcasecmp)( ctmbstr s1, ctmbstr s2 )
{
    uint c;

    while (c = (uint)(*s1), TY_(ToLower)(c) == TY_(ToLower)((uint)(*s2)))
    {
        if (c == '\0')
            return 0;

        ++s1;
        ++s2;
    }

    return (*s1 > *s2 ? 1 : -1);
}